

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

void tdefl_calculate_minimum_redundancy(tdefl_sym_freq *A,int n)

{
  bool bVar1;
  uint local_2c;
  int local_28;
  int dpth;
  int used;
  int avbl;
  int next;
  int leaf;
  int root;
  int n_local;
  tdefl_sym_freq *A_local;
  
  if (n != 0) {
    if (n == 1) {
      A->m_key = 1;
    }
    else {
      A->m_key = A->m_key + A[1].m_key;
      next = 0;
      avbl = 2;
      for (used = 1; used < n + -1; used = used + 1) {
        if ((avbl < n) && (A[avbl].m_key <= A[next].m_key)) {
          A[used].m_key = A[avbl].m_key;
          avbl = avbl + 1;
        }
        else {
          A[used].m_key = A[next].m_key;
          A[next].m_key = (mz_uint16)used;
          next = next + 1;
        }
        if ((avbl < n) && ((used <= next || (A[avbl].m_key <= A[next].m_key)))) {
          A[used].m_key = A[used].m_key + A[avbl].m_key;
          avbl = avbl + 1;
        }
        else {
          A[used].m_key = A[used].m_key + A[next].m_key;
          A[next].m_key = (mz_uint16)used;
          next = next + 1;
        }
      }
      A[n + -2].m_key = 0;
      for (used = n + -3; -1 < used; used = used + -1) {
        A[used].m_key = A[A[used].m_key].m_key + 1;
      }
      local_2c = 0;
      next = n + -2;
      used = n + -1;
      dpth = 1;
      while (local_28 = 0, 0 < dpth) {
        while( true ) {
          bVar1 = false;
          if (-1 < next) {
            bVar1 = A[next].m_key == local_2c;
          }
          if (!bVar1) break;
          local_28 = local_28 + 1;
          next = next + -1;
        }
        for (; local_28 < dpth; dpth = dpth + -1) {
          A[used].m_key = (mz_uint16)local_2c;
          used = used + -1;
        }
        local_2c = local_2c + 1;
        dpth = local_28 << 1;
      }
    }
  }
  return;
}

Assistant:

static void tdefl_calculate_minimum_redundancy(tdefl_sym_freq *A, int n)
{
  int root, leaf, next, avbl, used, dpth;
  if (n==0) return; else if (n==1) { A[0].m_key = 1; return; }
  A[0].m_key += A[1].m_key; root = 0; leaf = 2;
  for (next=1; next < n-1; next++)
  {
    if (leaf>=n || A[root].m_key<A[leaf].m_key) { A[next].m_key = A[root].m_key; A[root++].m_key = (mz_uint16)next; } else A[next].m_key = A[leaf++].m_key;
    if (leaf>=n || (root<next && A[root].m_key<A[leaf].m_key)) { A[next].m_key = (mz_uint16)(A[next].m_key + A[root].m_key); A[root++].m_key = (mz_uint16)next; } else A[next].m_key = (mz_uint16)(A[next].m_key + A[leaf++].m_key);
  }
  A[n-2].m_key = 0; for (next=n-3; next>=0; next--) A[next].m_key = A[A[next].m_key].m_key+1;
  avbl = 1; used = dpth = 0; root = n-2; next = n-1;
  while (avbl>0)
  {
    while (root>=0 && (int)A[root].m_key==dpth) { used++; root--; }
    while (avbl>used) { A[next--].m_key = (mz_uint16)(dpth); avbl--; }
    avbl = 2*used; dpth++; used = 0;
  }
}